

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  nes_system *system;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  SDL_Scancode key;
  float fVar8;
  SDL_Rect dstrect;
  int h;
  int w;
  SDL_Event evt;
  SDL_AudioSpec audio_spec_desired;
  SDL_AudioSpec audio_spec_obtained;
  char title [256];
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  float local_22c;
  int local_228;
  int local_224;
  undefined8 local_220;
  nes_system *local_218;
  int local_210 [2];
  uint local_208;
  SDL_Scancode local_200;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b0 [32];
  nes_config local_190;
  char local_138 [264];
  
  if (argc < 2) {
    pcVar7 = "rom.nes";
  }
  else {
    pcVar7 = argv[1];
  }
  audio_ring_buf.buffer = (uint8_t *)malloc(0x400);
  audio_ring_buf.capacity = 0x400;
  audio_ring_buf.write = 0;
  audio_ring_buf.read = 0;
  snprintf(local_138,0x100,"NESM - %s",pcVar7);
  snprintf(save_path,0x400,"%s_sav",pcVar7);
  local_190.source_type = NES_SOURCE_FILE;
  local_190.client_data = (void *)0x0;
  local_190.input_callback = on_nes_input;
  local_190.video_callback = on_nes_video;
  local_190.audio_callback = on_nes_audio;
  local_190.memory_callback =
       (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0;
  local_190.cpu_callback = (_func_void_uint16_t_cpu_state_ptr_void_ptr *)0x0;
  local_190.source.file_path = pcVar7;
  system = nes_system_create(&local_190);
  if (system == (nes_system *)0x0) {
    main_cold_1();
  }
  else {
    iVar2 = SDL_Init(0x230);
    if (iVar2 < 0) {
      uVar6 = SDL_GetError();
      pcVar7 = "Failed to initialized SDL2: %s\n";
    }
    else {
      wnd = (SDL_Window *)
            SDL_CreateWindow(local_138,0x2fff0000,0x2fff0000,wnd_scale << 8,wnd_scale * 0xe0,0x28);
      if (wnd == (SDL_Window *)0x0) {
        uVar6 = SDL_GetError();
        pcVar7 = "Failed to create window: %s\n";
      }
      else {
        renderer = (SDL_Renderer *)SDL_CreateRenderer(wnd,0xffffffff,6);
        if (renderer == (SDL_Renderer *)0x0) {
          uVar6 = SDL_GetError();
          SDL_LogError(0,"Failed to create renderer: %s\n",uVar6);
          return -1;
        }
        uStack_1c0 = 0;
        local_1d8 = 0x180100000ac44;
        uStack_1d0 = 0x200;
        local_1c8 = sdl_audio_callback;
        local_220 = 0;
        audio_device_id = SDL_OpenAudioDevice(0,0,&local_1d8,local_1b0,0);
        SDL_PauseAudioDevice(audio_device_id,0);
        SDL_SetHint("SDL_RENDER_SCALE_QUALITY","0");
        texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16762004,1,0x100,0xe0);
        if (texture != (SDL_Texture *)0x0) {
          texture_buffer = (uint32_t *)malloc(0x38000);
          controller[0] = (SDL_GameController *)0x0;
          controller[1] = (SDL_GameController *)0x0;
          SDL_ShowWindow(wnd);
          local_218 = system;
          do {
            lVar3 = SDL_GetPerformanceCounter();
            fVar8 = (float)video_srcrect.w;
            local_22c = (float)video_srcrect.h;
            iVar2 = SDL_PollEvent(local_210);
            key = SDL_SCANCODE_UNKNOWN;
            if (iVar2 == 0) {
              bVar1 = true;
            }
            else {
              bVar1 = false;
              do {
                if (local_210[0] < 0x605) {
                  if (local_210[0] == 0x100) {
                    local_220 = 1;
                  }
                  else if (local_210[0] == 0x301) {
                    bVar1 = true;
                    key = local_200;
                  }
                }
                else if (local_210[0] == 0x605) {
                  handle_joystick_added(local_208);
                }
                else if (((local_210[0] == 0x606) && (uVar5 = (ulong)local_208, uVar5 < 2)) &&
                        (controller[uVar5] != (SDL_GameController *)0x0)) {
                  SDL_GameControllerClose();
                  controller[uVar5] = (SDL_GameController *)0x0;
                }
                iVar2 = SDL_PollEvent(local_210);
              } while (iVar2 != 0);
              bVar1 = !bVar1;
              system = local_218;
            }
            if (!bVar1) {
              handle_shortcut_key(system,key);
            }
            fVar8 = fVar8 / local_22c;
            SDL_GetWindowSize(wnd,&local_224,&local_228);
            if (fVar8 <= (float)local_224 / (float)local_228) {
              local_238 = 0;
              local_230 = local_228;
              local_234 = (int)(fVar8 * (float)local_228);
              local_23c = local_224 - local_234 >> 1;
            }
            else {
              local_23c = 0;
              local_234 = local_224;
              local_230 = (int)((float)local_224 / fVar8);
              local_238 = local_228 - local_230 >> 1;
            }
            nes_system_frame(system);
            SDL_SetRenderDrawColor(renderer,0,0,0,0);
            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer,texture,&video_srcrect,&local_23c);
            SDL_RenderPresent(renderer);
            do {
              lVar4 = SDL_GetPerformanceCounter();
              uVar5 = SDL_GetPerformanceFrequency();
              uVar5 = (ulong)((lVar4 - lVar3) * 100000) / uVar5;
              if (uVar5 < 0x61e) {
                SDL_Delay(1);
              }
            } while (uVar5 < 0x682);
          } while ((int)local_220 == 0);
          SDL_DestroyWindow(wnd);
          SDL_CloseAudioDevice(audio_device_id);
          nes_system_destroy(system);
          free(texture_buffer);
          free(audio_ring_buf.buffer);
          if (state_buffer != (void *)0x0) {
            free(state_buffer);
          }
          if (controller[0] != (SDL_GameController *)0x0) {
            SDL_GameControllerClose();
          }
          if (controller[1] != (SDL_GameController *)0x0) {
            SDL_GameControllerClose();
          }
          SDL_Quit();
          return 0;
        }
        uVar6 = SDL_GetError();
        pcVar7 = "Failed to create texture: %s\n";
      }
    }
    SDL_LogError(0,pcVar7,uVar6);
  }
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
    const char*     rom_path = argc > 1 ? argv[1] : "rom.nes";
    char            title[256];
    int             quit = 0;
    nes_config      config;
    nes_system*     system = 0;
    SDL_AudioSpec   audio_spec_desired, audio_spec_obtained;

    init_audio_ring_buf();

    snprintf(title, 256, "NESM - %s", rom_path);
    snprintf(save_path, 1024, "%s_sav", rom_path);

    config.source_type = NES_SOURCE_FILE;
    config.source.file_path = rom_path;
    config.client_data = 0;
    config.input_callback = &on_nes_input;
    config.video_callback = &on_nes_video;
    config.audio_callback = &on_nes_audio;
    config.memory_callback = 0;
    config.cpu_callback = 0;

    system = nes_system_create(&config);
    if (!system)
    {
        fprintf(stderr, "Failed to initialized NES system.\n");
        return -1;
    }

    if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_AUDIO | SDL_INIT_JOYSTICK) < 0)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to initialized SDL2: %s\n", SDL_GetError());
        return -1;
    }

    wnd = SDL_CreateWindow(title, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, 
            TEXTURE_WIDTH * wnd_scale, TEXTURE_HEIGHT * wnd_scale, SDL_WINDOW_RESIZABLE | SDL_WINDOW_HIDDEN);
    if (!wnd)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create window: %s\n", SDL_GetError());
        return -1;
    }

    renderer = SDL_CreateRenderer(wnd, -1, SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC);
    if (!renderer)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create renderer: %s\n", SDL_GetError());
        return -1;
    }

    memset(&audio_spec_desired, 0, sizeof(SDL_AudioSpec));
    audio_spec_desired.freq = SAMPLE_RATE;
    audio_spec_desired.channels = 1;
    audio_spec_desired.format = AUDIO_S16;
    audio_spec_desired.samples = 512;
    audio_spec_desired.callback = sdl_audio_callback;
    audio_device_id = SDL_OpenAudioDevice(0, 0, &audio_spec_desired, &audio_spec_obtained, 0);
    if (audio_device_id < 0)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Failed to open audio device: %s\n", SDL_GetError());
    }
    SDL_PauseAudioDevice(audio_device_id, 0);

    SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "0");
    texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ABGR8888, SDL_TEXTUREACCESS_STREAMING, TEXTURE_WIDTH, TEXTURE_HEIGHT);
    if (!texture)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create texture: %s\n", SDL_GetError());
        return -1;
    }

    texture_buffer = (uint32_t*)malloc(TEXTURE_WIDTH * TEXTURE_HEIGHT * sizeof(uint32_t));

    memset(&controller, 0, 2 * sizeof(SDL_GameController*));

    SDL_ShowWindow(wnd);

    while(!quit)
    {
        uint64_t begin_frame = SDL_GetPerformanceCounter();

        int w, h, has_key_up = 0;
        SDL_Scancode key_up_scancode = (SDL_Scancode)0;
        SDL_Rect dstrect;
        SDL_Event evt;
        float aspect_ratio = (float)video_srcrect.w / (float)video_srcrect.h;

        while (SDL_PollEvent(&evt))
        {
            if (evt.type == SDL_QUIT) quit = 1;
            else if (evt.type == SDL_KEYUP)
            {
                has_key_up = 1;
                key_up_scancode = evt.key.keysym.scancode;
            }
            else if (evt.type == SDL_JOYDEVICEADDED)
            {
                handle_joystick_added(evt.jdevice.which);
            }
            else if (evt.type == SDL_JOYDEVICEREMOVED)
            {
                handle_joystick_removed(evt.jdevice.which);
            }
        }

        if (has_key_up)
            handle_shortcut_key(system, key_up_scancode);

        SDL_GetWindowSize(wnd, &w, &h);
        if (((float)w / (float)h) >= aspect_ratio)
        {
            dstrect.y = 0;
            dstrect.h = h;
            dstrect.w = (int)((float)h * aspect_ratio);
            dstrect.x = (w - dstrect.w)>>1;
        }
        else
        {
            dstrect.x = 0;
            dstrect.w = w;
            dstrect.h = (int)((float)w / aspect_ratio);
            dstrect.y = (h - dstrect.h)>>1;
        }

        nes_system_frame(system);

        SDL_SetRenderDrawColor(renderer, 0, 0, 0, 0);
        SDL_RenderClear(renderer);
        SDL_RenderCopy(renderer, texture, &video_srcrect, &dstrect);
        SDL_RenderPresent(renderer);

        uint64_t frame_time = 0;
        while(frame_time < 1666)
        {
           frame_time  = ((SDL_GetPerformanceCounter() - begin_frame)*100000)/SDL_GetPerformanceFrequency();
           if (frame_time < 1666 && (1666 - frame_time) > 100)
               SDL_Delay(1);
        }
    }

    SDL_DestroyWindow(wnd);
    if (audio_device_id >= 0)
        SDL_CloseAudioDevice(audio_device_id);

    nes_system_destroy(system);
    free(texture_buffer);
    free(audio_ring_buf.buffer);

    if (state_buffer)
        free(state_buffer);

    if (controller[0]) SDL_GameControllerClose(controller[0]);
    if (controller[1]) SDL_GameControllerClose(controller[1]);

    SDL_Quit();
    return 0;
}